

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O0

void outputHandleDone(void *userData,wl_output *output)

{
  int *piVar1;
  int local_2c;
  int i;
  GLFWvidmode *mode;
  _GLFWmonitor *monitor;
  wl_output *output_local;
  void *userData_local;
  
  if ((*(int *)((long)userData + 0x88) < 1) || (*(int *)((long)userData + 0x8c) < 1)) {
    piVar1 = (int *)(*(long *)((long)userData + 0x98) +
                    (long)*(int *)((long)userData + 0x10c) * 0x18);
    *(int *)((long)userData + 0x88) = (int)(((float)*piVar1 * 25.4) / 96.0);
    *(int *)((long)userData + 0x8c) = (int)(((float)piVar1[1] * 25.4) / 96.0);
  }
  local_2c = 0;
  while( true ) {
    if (_glfw.monitorCount <= local_2c) {
      _glfwInputMonitor((_GLFWmonitor *)userData,0x40001,1);
      return;
    }
    if (_glfw.monitors[local_2c] == (_GLFWmonitor *)userData) break;
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void outputHandleDone(void* userData, struct wl_output* output)
{
    struct _GLFWmonitor* monitor = userData;

    if (monitor->widthMM <= 0 || monitor->heightMM <= 0)
    {
        // If Wayland does not provide a physical size, assume the default 96 DPI
        const GLFWvidmode* mode = &monitor->modes[monitor->wl.currentMode];
        monitor->widthMM  = (int) (mode->width * 25.4f / 96.f);
        monitor->heightMM = (int) (mode->height * 25.4f / 96.f);
    }

    for (int i = 0; i < _glfw.monitorCount; i++)
    {
        if (_glfw.monitors[i] == monitor)
            return;
    }

    _glfwInputMonitor(monitor, GLFW_CONNECTED, _GLFW_INSERT_LAST);
}